

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventBroadcaster.h
# Opt level: O0

bool __thiscall
TgBot::EventBroadcaster::broadcastCommand(EventBroadcaster *this,string *command,Ptr *message)

{
  bool bVar1;
  pointer pvVar2;
  shared_ptr<TgBot::Message> local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
  local_30;
  const_iterator iter;
  Ptr *message_local;
  string *command_local;
  EventBroadcaster *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_true>
               )message;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>_>_>
       ::find(&this->_onCommandListeners,command);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>_>_>
       ::end(&this->_onCommandListeners);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (!bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<TgBot::Message>)>_>,_false,_true>
                           *)&local_30);
    std::shared_ptr<TgBot::Message>::shared_ptr(&local_48,message);
    std::function<void_(std::shared_ptr<TgBot::Message>)>::operator()(&pvVar2->second,&local_48);
    std::shared_ptr<TgBot::Message>::~shared_ptr(&local_48);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool broadcastCommand(const std::string command, const Message::Ptr message) const {
        std::unordered_map<std::string, MessageListener>::const_iterator iter = _onCommandListeners.find(command);
        if (iter == _onCommandListeners.end()) {
            return false;
        }
        iter->second(message);
        return true;
    }